

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushFocusScope(ImGuiID id)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  uint *puVar4;
  ImGuiContext *pIVar5;
  uint *__dest;
  int iVar6;
  int iVar7;
  ImGuiContext *ctx;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  iVar7 = (GImGui->FocusScopeStack).Size;
  iVar2 = (GImGui->FocusScopeStack).Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar7 << 2,GImAllocatorUserData);
      puVar4 = (pIVar5->FocusScopeStack).Data;
      if (puVar4 != (uint *)0x0) {
        memcpy(__dest,puVar4,(long)(pIVar5->FocusScopeStack).Size << 2);
        puVar4 = (pIVar5->FocusScopeStack).Data;
        if ((puVar4 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
      }
      (pIVar5->FocusScopeStack).Data = __dest;
      (pIVar5->FocusScopeStack).Capacity = iVar7;
    }
  }
  (pIVar5->FocusScopeStack).Data[(pIVar5->FocusScopeStack).Size] =
       (pIVar3->DC).NavFocusScopeIdCurrent;
  (pIVar5->FocusScopeStack).Size = (pIVar5->FocusScopeStack).Size + 1;
  (pIVar3->DC).NavFocusScopeIdCurrent = id;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    g.FocusScopeStack.push_back(window->DC.NavFocusScopeIdCurrent);
    window->DC.NavFocusScopeIdCurrent = id;
}